

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_24_5_e9a28bf2 *
qclab::qgates::lambda_QGate1<float>
          (anon_class_24_5_e9a28bf2 *__return_storage_ptr__,Op op,SquareMatrix<float> *mat1,
          float *vector)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int64_t iVar5;
  float *pfVar6;
  anon_class_24_5_e9a28bf2 f;
  float m22;
  float m21;
  float m12;
  float m11;
  float *vector_local;
  SquareMatrix<float> *mat1_local;
  Op op_local;
  
  iVar5 = dense::SquareMatrix<float>::size(mat1);
  if (iVar5 == 2) {
    dense::operateInPlace<qclab::dense::SquareMatrix<float>>(op,mat1);
    pfVar6 = dense::SquareMatrix<float>::operator()(mat1,0,0);
    fVar1 = *pfVar6;
    pfVar6 = dense::SquareMatrix<float>::operator()(mat1,0,1);
    fVar2 = *pfVar6;
    pfVar6 = dense::SquareMatrix<float>::operator()(mat1,1,0);
    fVar3 = *pfVar6;
    pfVar6 = dense::SquareMatrix<float>::operator()(mat1,1,1);
    fVar4 = *pfVar6;
    __return_storage_ptr__->vector = vector;
    __return_storage_ptr__->m11 = fVar1;
    __return_storage_ptr__->m12 = fVar2;
    __return_storage_ptr__->m21 = fVar3;
    __return_storage_ptr__->m22 = fVar4;
    return __return_storage_ptr__;
  }
  __assert_fail("mat1.size() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/apply.hpp"
                ,0xd,
                "auto qclab::qgates::lambda_QGate1(Op, qclab::dense::SquareMatrix<T>, T *) [T = float]"
               );
}

Assistant:

auto lambda_QGate1( Op op , qclab::dense::SquareMatrix< T > mat1 ,
                      T* vector ) {
    assert( mat1.size() == 2 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat1 ) ;
    const T m11 = mat1( 0 , 0 ) ; const T m12 = mat1( 0 , 1 ) ;
    const T m21 = mat1( 1 , 0 ) ; const T m22 = mat1( 1 , 1 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      vector[a] = m11 * x1 + m12 * x2 ;
      vector[b] = m21 * x1 + m22 * x2 ;
    } ;
    return f ;
  }